

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *pMVar1;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  BrotliEncoderStreamState BVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *puVar11;
  int *table;
  byte bVar12;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint8_t *puVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  bool bVar23;
  bool bVar24;
  size_t sVar25;
  uint uVar26;
  bool bVar27;
  uint32_t *local_b0;
  uint32_t *local_98;
  uint8_t *local_90;
  uint8_t *local_88;
  size_t storage_ix;
  uint local_60;
  BrotliEncoderStreamState local_5c;
  uint8_t *local_58;
  size_t *local_50;
  uint16_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  byte bVar13;
  
  if (s->is_initialized_ == 0) {
    s->last_bytes_ = 0;
    s->last_bytes_bits_ = '\0';
    s->flint_ = -2;
    s->remaining_metadata_bytes_ = 0xffffffff;
    uVar5 = (s->params).quality;
    uVar18 = 0;
    if (0 < (int)uVar5) {
      uVar18 = uVar5;
    }
    uVar26 = 0xb;
    if ((int)uVar18 < 0xb) {
      uVar26 = uVar18;
    }
    (s->params).quality = uVar26;
    if ((int)uVar5 < 3) {
      (s->params).large_window = 0;
    }
    uVar18 = (s->params).lgwin;
    if ((int)uVar18 < 10) {
      uVar26 = 10;
LAB_00105898:
      uVar18 = uVar26;
      (s->params).lgwin = uVar18;
    }
    else {
      uVar26 = 0x1e;
      if ((s->params).large_window == 0) {
        uVar26 = 0x18;
      }
      if (uVar26 < uVar18) goto LAB_00105898;
    }
    uVar26 = uVar18;
    if (1 < (int)uVar5) {
      if (uVar5 < 4) {
        uVar26 = 0xe;
      }
      else {
        uVar17 = (s->params).lgblock;
        if (uVar17 == 0) {
          uVar26 = 0x10;
          if (((8 < uVar5) && (0x10 < uVar18)) && (uVar26 = uVar18, 0x11 < uVar18)) {
            uVar26 = 0x12;
          }
        }
        else {
          if ((int)uVar17 < 0x11) {
            uVar17 = 0x10;
          }
          uVar26 = 0x18;
          if ((int)uVar17 < 0x18) {
            uVar26 = uVar17;
          }
        }
      }
    }
    (s->params).lgblock = uVar26;
    ChooseDistanceParams(&s->params);
    uVar14 = (s->params).stream_offset;
    if (uVar14 != 0) {
      s->flint_ = '\x02';
      s->dist_cache_[0] = -0x10;
      s->dist_cache_[1] = -0x10;
      s->dist_cache_[2] = -0x10;
      s->dist_cache_[3] = -0x10;
      uVar3 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar3;
    }
    uVar18 = (s->params).quality;
    uVar5 = (s->params).lgwin;
    iVar4 = (s->params).lgblock;
    bVar12 = (byte)iVar4;
    bVar13 = bVar12;
    if (iVar4 < (int)uVar5) {
      bVar13 = (byte)uVar5;
    }
    uVar22 = 1 << (bVar13 + 1 & 0x1f);
    uVar21 = 1 << (bVar12 & 0x1f);
    uVar26 = 0x12;
    if (0x12 < (int)uVar5) {
      uVar26 = uVar5;
    }
    if (1 < uVar18) {
      uVar26 = uVar5;
    }
    (s->ringbuffer_).size_ = uVar22;
    (s->ringbuffer_).mask_ = uVar22 - 1;
    (s->ringbuffer_).tail_size_ = uVar21;
    (s->ringbuffer_).total_size_ = uVar22 + uVar21;
    if (uVar14 == 0) {
      EncodeWindowBits(uVar26,(s->params).large_window,&s->last_bytes_,&s->last_bytes_bits_);
      uVar18 = (s->params).quality;
    }
    else {
      uVar7 = (1L << ((byte)uVar26 & 0x3f)) - 0x10;
      if (uVar14 < uVar7) {
        uVar7 = uVar14;
      }
      (s->params).stream_offset = uVar7;
    }
    if (uVar18 == 0) {
      memcpy(s->cmd_depths_,InitCommandPrefixCodes_kDefaultCommandDepths,0x80);
      memcpy(s->cmd_bits_,InitCommandPrefixCodes_kDefaultCommandBits,0x100);
      s->cmd_code_[0] = 0xff;
      s->cmd_code_[1] = 'w';
      s->cmd_code_[2] = 0xd5;
      s->cmd_code_[3] = 0xbf;
      s->cmd_code_[4] = 0xe7;
      s->cmd_code_[5] = 0xde;
      s->cmd_code_[6] = 0xea;
      s->cmd_code_[7] = 0x9e;
      s->cmd_code_[8] = 'Q';
      s->cmd_code_[9] = ']';
      s->cmd_code_[10] = 0xde;
      s->cmd_code_[0xb] = 0xc6;
      s->cmd_code_[0xc] = 'p';
      s->cmd_code_[0xd] = 'W';
      s->cmd_code_[0xe] = 0xbc;
      s->cmd_code_[0xf] = 'X';
      s->cmd_code_[0x10] = 'X';
      s->cmd_code_[0x11] = 'X';
      s->cmd_code_[0x12] = 0xd8;
      s->cmd_code_[0x13] = 0xd8;
      s->cmd_code_[0x14] = 'X';
      s->cmd_code_[0x15] = 0xd5;
      s->cmd_code_[0x16] = 0xcb;
      s->cmd_code_[0x17] = 0x8c;
      s->cmd_code_[0x18] = 0xea;
      s->cmd_code_[0x19] = 0xe0;
      s->cmd_code_[0x1a] = 0xc3;
      s->cmd_code_[0x1b] = 0x87;
      s->cmd_code_[0x1c] = '\x1f';
      s->cmd_code_[0x1d] = 0x83;
      s->cmd_code_[0x1e] = 0xc1;
      s->cmd_code_[0x1f] = '`';
      s->cmd_code_[0x20] = '\x1c';
      s->cmd_code_[0x21] = 'g';
      s->cmd_code_[0x22] = 0xb2;
      s->cmd_code_[0x23] = 0xaa;
      s->cmd_code_[0x24] = '\x06';
      s->cmd_code_[0x25] = 0x83;
      s->cmd_code_[0x26] = 0xc1;
      s->cmd_code_[0x27] = '`';
      s->cmd_code_[0x28] = '0';
      s->cmd_code_[0x29] = '\x18';
      s->cmd_code_[0x2a] = 0xcc;
      s->cmd_code_[0x2b] = 0xa1;
      s->cmd_code_[0x2c] = 0xce;
      s->cmd_code_[0x2d] = 0x88;
      s->cmd_code_[0x2e] = 'T';
      s->cmd_code_[0x2f] = 0x94;
      s->cmd_code_[0x29] = '\x18';
      s->cmd_code_[0x2a] = 0xcc;
      s->cmd_code_[0x2b] = 0xa1;
      s->cmd_code_[0x2c] = 0xce;
      s->cmd_code_[0x2d] = 0x88;
      s->cmd_code_[0x2e] = 'T';
      s->cmd_code_[0x2f] = 0x94;
      s->cmd_code_[0x30] = 'F';
      s->cmd_code_[0x31] = 0xe1;
      s->cmd_code_[0x32] = 0xb0;
      s->cmd_code_[0x33] = 0xd0;
      s->cmd_code_[0x34] = 'N';
      s->cmd_code_[0x35] = 0xb2;
      s->cmd_code_[0x36] = 0xf7;
      s->cmd_code_[0x37] = '\x04';
      s->cmd_code_[0x38] = '\0';
      s->cmd_code_numbits_ = 0x1c0;
    }
    s->is_initialized_ = 1;
  }
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_00105a60:
    UpdateSizeHint(s,0);
    if (0x1000000 < *available_in) {
      return 0;
    }
    if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      s->remaining_metadata_bytes_ = (uint32_t)*available_in;
      s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
    }
    else if (1 < s->stream_state_ - BROTLI_STREAM_METADATA_HEAD) {
      return 0;
    }
    __dest = &s->tiny_buf_;
    do {
      while( true ) {
        while( true ) {
          do {
            iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar4 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ == s->last_flush_pos_) break;
          iVar4 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
          if (iVar4 == 0) {
            return 0;
          }
        }
        if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) break;
        uVar5 = s->remaining_metadata_bytes_;
        uVar14 = (ulong)uVar5;
        if (uVar14 == 0) {
          s->remaining_metadata_bytes_ = 0xffffffff;
          s->stream_state_ = BROTLI_STREAM_PROCESSING;
          return 1;
        }
        uVar7 = *available_out;
        if (uVar7 == 0) {
          sVar25 = (size_t)uVar5;
          if (0xf < uVar5) {
            sVar25 = 0x10;
          }
          s->next_out_ = (uint8_t *)__dest;
          memcpy(__dest,*next_in,sVar25);
          *next_in = *next_in + sVar25;
          *available_in = *available_in - sVar25;
          s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)sVar25;
          s->available_out_ = sVar25;
        }
        else {
          if (uVar14 < uVar7) {
            uVar7 = uVar14;
          }
          memcpy(*next_out,*next_in,uVar7);
          *next_in = *next_in + uVar7;
          *available_in = *available_in - uVar7;
          s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar7;
          *next_out = *next_out + uVar7;
          *available_out = *available_out - uVar7;
        }
      }
      s->next_out_ = (uint8_t *)__dest;
      uVar5 = s->remaining_metadata_bytes_;
      bVar13 = s->last_bytes_bits_;
      uVar19 = (ulong)bVar13;
      *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
      s->last_bytes_ = 0;
      s->last_bytes_bits_ = '\0';
      *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar13 >> 3)) = (ulong)(s->tiny_buf_).u8[bVar13 >> 3]
      ;
      uVar7 = uVar19 + 1 >> 3;
      uVar15 = (ulong)(bVar13 + 3 >> 3);
      uVar14 = uVar19 + 4;
      *(ulong *)((long)&s->tiny_buf_ + uVar7) =
           3L << ((byte)(uVar19 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar7];
      *(ulong *)((long)&s->tiny_buf_ + uVar15) = (ulong)(s->tiny_buf_).u8[uVar15];
      if ((ulong)uVar5 == 1) {
        uVar18 = 0;
LAB_00105d92:
        uVar7 = uVar19 + (ulong)uVar18 * 8;
        *(ulong *)((long)__dest + (uVar14 >> 3)) =
             (ulong)uVar18 << ((byte)uVar14 & 7) | (ulong)__dest->u8[uVar14 >> 3];
        uVar14 = uVar19 + 6 >> 3;
        *(ulong *)((long)__dest + uVar14) =
             (ulong)uVar5 - 1 << ((byte)(uVar19 + 6) & 7) | (ulong)__dest->u8[uVar14];
      }
      else {
        if (uVar5 != 0) {
          uVar18 = 0x1f;
          if (uVar5 - 1 != 0) {
            for (; uVar5 - 1 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar18 = (uVar18 ^ 0xffffffe0) + 0x28 >> 3;
          goto LAB_00105d92;
        }
        *(ulong *)((long)__dest + (uVar14 >> 3)) = (ulong)__dest->u8[uVar14 >> 3];
        uVar7 = uVar19;
      }
      s->available_out_ = uVar7 + 0xd >> 3;
      s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
    } while( true );
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_00105a60;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar5 = (s->params).quality;
  if (1 < uVar5) {
    pMVar1 = &s->memory_manager_;
    while( true ) {
      while( true ) {
        while( true ) {
          uVar7 = s->input_pos_ - s->last_processed_pos_;
          uVar19 = 1L << ((byte)(s->params).lgblock & 0x3f);
          uVar14 = uVar19 - uVar7;
          if (uVar19 < uVar7) {
            uVar14 = 0;
          }
          uVar19 = (ulong)s->flint_;
          uVar7 = uVar19;
          if (uVar14 < uVar19) {
            uVar7 = uVar14;
          }
          if ((long)uVar19 < 0) {
            uVar7 = uVar14;
          }
          if ((uVar7 == 0) || (uVar14 = *available_in, uVar14 == 0)) break;
          if (uVar7 < uVar14) {
            uVar14 = uVar7;
          }
          puVar11 = *next_in;
          uVar21 = (s->ringbuffer_).pos_;
          uVar5 = (uint)uVar14;
          if ((uVar21 == 0) && (uVar14 < (s->ringbuffer_).tail_size_)) {
            (s->ringbuffer_).pos_ = uVar5;
            puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar5 + 2) + 7);
            puVar20 = (s->ringbuffer_).data_;
            if (puVar20 != (uint8_t *)0x0) {
              memcpy(puVar9,puVar20,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(pMVar1,(s->ringbuffer_).data_);
            }
            (s->ringbuffer_).data_ = puVar9;
            (s->ringbuffer_).cur_size_ = uVar5;
            (s->ringbuffer_).buffer_ = puVar9 + 2;
            puVar9[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            for (lVar10 = 0; puVar20 = (s->ringbuffer_).buffer_, lVar10 != 7; lVar10 = lVar10 + 1) {
              puVar20[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
            }
            memcpy(puVar20,puVar11,uVar14);
            uVar5 = (s->ringbuffer_).pos_;
          }
          else {
            uVar18 = (s->ringbuffer_).total_size_;
            if ((s->ringbuffer_).cur_size_ < uVar18) {
              puVar9 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar18 + 2) + 7);
              puVar20 = (s->ringbuffer_).data_;
              if (puVar20 != (uint8_t *)0x0) {
                memcpy(puVar9,puVar20,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
                BrotliFree(pMVar1,(s->ringbuffer_).data_);
              }
              (s->ringbuffer_).data_ = puVar9;
              (s->ringbuffer_).cur_size_ = uVar18;
              (s->ringbuffer_).buffer_ = puVar9 + 2;
              puVar9[1] = '\0';
              (s->ringbuffer_).buffer_[-2] = '\0';
              for (lVar10 = 0; puVar20 = (s->ringbuffer_).buffer_, lVar10 != 7; lVar10 = lVar10 + 1)
              {
                puVar20[lVar10 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              }
              puVar20[(s->ringbuffer_).size_ - 2] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_] = 0xf1;
              uVar21 = (s->ringbuffer_).pos_;
            }
            uVar26 = uVar21 & (s->ringbuffer_).mask_;
            uVar19 = (ulong)uVar26;
            uVar7 = (ulong)(s->ringbuffer_).size_;
            uVar18 = (s->ringbuffer_).tail_size_;
            if (uVar26 < uVar18) {
              uVar15 = uVar18 - uVar19;
              if (uVar14 < uVar15) {
                uVar15 = uVar14;
              }
              memcpy((s->ringbuffer_).buffer_ + uVar19 + uVar7,puVar11,uVar15);
              uVar7 = (ulong)(s->ringbuffer_).size_;
            }
            puVar20 = (s->ringbuffer_).buffer_ + uVar19;
            sVar25 = uVar14;
            if (uVar7 < uVar14 + uVar19) {
              uVar7 = (s->ringbuffer_).total_size_ - uVar19;
              if (uVar14 < uVar7) {
                uVar7 = uVar14;
              }
              memcpy(puVar20,puVar11,uVar7);
              puVar20 = (s->ringbuffer_).buffer_;
              lVar10 = (s->ringbuffer_).size_ - uVar19;
              puVar11 = puVar11 + lVar10;
              sVar25 = uVar14 - lVar10;
            }
            memcpy(puVar20,puVar11,sVar25);
            puVar11 = (s->ringbuffer_).buffer_;
            uVar18 = (s->ringbuffer_).pos_;
            puVar11[-2] = puVar11[(s->ringbuffer_).size_ - 2];
            puVar11 = (s->ringbuffer_).buffer_;
            puVar11[-1] = puVar11[(s->ringbuffer_).size_ - 1];
            uVar5 = (uVar5 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) |
                    uVar18 & 0x80000000;
            (s->ringbuffer_).pos_ = uVar5;
          }
          s->input_pos_ = s->input_pos_ + uVar14;
          if (uVar5 <= (s->ringbuffer_).mask_) {
            puVar11 = (s->ringbuffer_).buffer_;
            puVar20 = puVar11 + (ulong)uVar5 + 3;
            puVar20[0] = '\0';
            puVar20[1] = '\0';
            puVar20[2] = '\0';
            puVar20[3] = '\0';
            puVar11 = puVar11 + uVar5;
            puVar11[0] = '\0';
            puVar11[1] = '\0';
            puVar11[2] = '\0';
            puVar11[3] = '\0';
          }
          *next_in = *next_in + uVar14;
          *available_in = *available_in - uVar14;
          if ('\0' < s->flint_) {
            s->flint_ = s->flint_ - (char)uVar14;
          }
        }
        iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar4 == 0) break;
        if ((s->flint_ == -1) &&
           (CheckFlushComplete(s), s->stream_state_ == BROTLI_STREAM_PROCESSING)) {
          s->flint_ = -2;
        }
      }
      if (((s->available_out_ != 0) || (op == BROTLI_OPERATION_PROCESS && uVar7 != 0)) ||
         (s->stream_state_ != BROTLI_STREAM_PROCESSING)) break;
      sVar16 = *available_in;
      bVar27 = sVar16 == 0;
      bVar23 = op == BROTLI_OPERATION_FINISH && bVar27;
      bVar24 = op == BROTLI_OPERATION_FLUSH && bVar27;
      if ((op != BROTLI_OPERATION_FINISH || !bVar27) && (s->flint_ == '\0')) {
        s->flint_ = -1;
        bVar24 = true;
      }
      UpdateSizeHint(s,sVar16);
      uVar5 = (uint)bVar23;
      iVar4 = EncodeData(s,uVar5,(uint)bVar24,&s->available_out_,&s->next_out_);
      if (iVar4 == 0) {
        return 0;
      }
      if ((bVar23 | bVar24) == 1) {
        s->stream_state_ = uVar5 + BROTLI_STREAM_FLUSH_REQUESTED;
      }
    }
    CheckFlushComplete(s);
    return 1;
  }
  uVar19 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar14 = *available_in;
  uVar7 = uVar19;
  if (uVar14 < uVar19) {
    uVar7 = uVar14;
  }
  sVar16 = 0x20000;
  if (uVar7 < 0x20000) {
    sVar16 = uVar7;
  }
  pMVar1 = &s->memory_manager_;
  if (uVar5 == 1) {
    local_b0 = s->command_buf_;
    if ((local_b0 == (uint32_t *)0x0) && (0x1ffff < uVar7)) {
      puVar8 = (uint32_t *)BrotliAllocate(pMVar1,0x80000);
      s->command_buf_ = puVar8;
      local_88 = (uint8_t *)BrotliAllocate(pMVar1,0x20000);
      s->literal_buf_ = local_88;
      local_b0 = s->command_buf_;
      if (local_b0 != (uint32_t *)0x0) goto LAB_0010635d;
    }
    else {
      if (local_b0 != (uint32_t *)0x0) {
        local_88 = s->literal_buf_;
        goto LAB_0010635d;
      }
      if (uVar14 == 0) goto LAB_00106342;
    }
    local_b0 = (uint32_t *)BrotliAllocate(pMVar1,sVar16 * 4);
    local_90 = (uint8_t *)BrotliAllocate(pMVar1,sVar16);
    local_98 = local_b0;
    local_88 = local_90;
  }
  else {
LAB_00106342:
    local_88 = (uint8_t *)0x0;
    local_b0 = (uint32_t *)0x0;
LAB_0010635d:
    local_90 = (uint8_t *)0x0;
    local_98 = (uint32_t *)0x0;
  }
  local_40 = s->cmd_depths_;
  local_48 = s->cmd_bits_;
  local_50 = &s->cmd_code_numbits_;
  local_58 = s->cmd_code_;
  local_60 = op - BROTLI_OPERATION_FLUSH;
  local_5c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_001063b9:
  do {
    iVar4 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar4 != 0);
  if (((s->available_out_ != 0) || (s->stream_state_ != BROTLI_STREAM_PROCESSING)) ||
     (uVar14 = *available_in, op == BROTLI_OPERATION_PROCESS && uVar14 == 0)) {
    BrotliFree(pMVar1,local_98);
    BrotliFree(pMVar1,local_90);
    CheckFlushComplete(s);
    return 1;
  }
  uVar7 = uVar14;
  if (uVar14 > uVar19) {
    uVar7 = uVar19;
  }
  storage_ix = (size_t)s->last_bytes_bits_;
  BVar6 = BROTLI_STREAM_FLUSH_REQUESTED;
  if (op != BROTLI_OPERATION_FLUSH || uVar14 != 0) goto code_r0x00106443;
  goto LAB_001065b9;
code_r0x00106443:
  uVar15 = uVar7 * 2 + 0x1f7;
  uVar2 = *available_out;
  if (uVar2 < uVar15) {
    puVar11 = GetBrotliStorage(s,uVar15);
  }
  else {
    puVar11 = *next_out;
  }
  uVar5 = (uint)(op == BROTLI_OPERATION_FINISH && uVar14 <= uVar19);
  *puVar11 = (uint8_t)s->last_bytes_;
  puVar11[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar7,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (pMVar1,*next_in,uVar7,uVar5,table,local_38,local_40,local_48,local_50,local_58,
               &storage_ix,puVar11);
  }
  else {
    BrotliCompressFragmentTwoPass
              (pMVar1,*next_in,uVar7,uVar5,local_b0,local_88,table,local_38,&storage_ix,puVar11);
  }
  if (uVar14 != 0) {
    *next_in = *next_in + uVar7;
    *available_in = *available_in - uVar7;
  }
  uVar7 = storage_ix >> 3;
  if (uVar2 < uVar15) {
    s->next_out_ = puVar11;
    s->available_out_ = uVar7;
  }
  else {
    *next_out = *next_out + uVar7;
    *available_out = *available_out - uVar7;
    sVar16 = s->total_out_ + uVar7;
    s->total_out_ = sVar16;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar16;
    }
  }
  s->last_bytes_ = (ushort)puVar11[uVar7];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar6 = local_5c;
  if (local_60 < 2 && uVar14 <= uVar19) {
LAB_001065b9:
    s->stream_state_ = BVar6;
  }
  goto LAB_001063b9;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);
    /* Shorten input to flint size. */
    if (s->flint_ >= 0 && remaining_block_size > (size_t)s->flint_) {
      remaining_block_size = (size_t)s->flint_;
    }

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      if (s->flint_ > 0) s->flint_ = (int8_t)(s->flint_ - (int)copy_input_size);
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      /* Exit the "emit flint" workflow. */
      if (s->flint_ == BROTLI_FLINT_WAITING_FOR_FLUSHING) {
        CheckFlushComplete(s);
        if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
          s->flint_ = BROTLI_FLINT_DONE;
        }
      }
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        /* Force emitting (uncompressed) piece containing flint. */
        if (!is_last && s->flint_ == 0) {
          s->flint_ = BROTLI_FLINT_WAITING_FOR_FLUSHING;
          force_flush = BROTLI_TRUE;
        }
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}